

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall
Am_Object_Data::propagate_constraint
          (Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *constraint,Am_Slot_Data *proto)

{
  Am_Object_Data *this_00;
  Am_Object_Data **ppAVar1;
  
  ppAVar1 = &this->first_instance;
  while (this_00 = *ppAVar1, this_00 != (Am_Object_Data *)0x0) {
    set_constraint(this_00,key,constraint,proto);
    ppAVar1 = &this_00->next_instance;
  }
  return;
}

Assistant:

void
Am_Object_Data::propagate_constraint(Am_Slot_Key key, Am_Constraint *constraint,
                                     Am_Slot_Data *proto)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  Am_Object_Data *current = first_instance;
  while (current) {
    current->set_constraint(key, constraint, proto);
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
}